

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void * __thiscall HACD::MyHeapManager::heap_malloc(MyHeapManager *this,size_t size)

{
  int iVar1;
  undefined4 extraout_var;
  void *pvVar2;
  
  if (size < 0x101) {
    iVar1 = (**this->mMicro->_vptr_MicroAllocator)();
    return (void *)CONCAT44(extraout_var,iVar1);
  }
  pvVar2 = malloc(size);
  return pvVar2;
}

Assistant:

virtual void * heap_malloc(size_t size)
  {
    void *ret;

    if ( size <= 256 ) // micro allocator only handles allocations between 0 and 256 bytes in length.
    {
        ret = mMicro->malloc(size);
    }
    else
    {
        ret = ::malloc(size);
    }
    return ret;
  }